

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_gcd.c
# Opt level: O0

void ppGCD(word *d,word *a,size_t n,word *b,size_t m,void *stack)

{
  int iVar1;
  bool_t bVar2;
  word *b_00;
  word *a_00;
  size_t sVar3;
  word *in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  ulong in_R8;
  word *in_R9;
  word *v;
  word *u;
  size_t s;
  size_t in_stack_ffffffffffffff80;
  word *a_01;
  size_t in_stack_ffffffffffffff88;
  word *in_stack_ffffffffffffff90;
  word *in_stack_ffffffffffffff98;
  size_t local_58;
  word *local_28;
  size_t local_18;
  
  b_00 = in_R9 + in_RDX;
  local_58 = in_R8;
  if (in_RDX < in_R8) {
    local_58 = in_RDX;
  }
  wwSetZero(in_RDI,local_58);
  wwCopy(in_R9,in_RSI,in_RDX);
  wwCopy(b_00,in_RCX,in_R8);
  a_00 = (word *)wwLoZeroBits(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  sVar3 = wwLoZeroBits(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  utilMin(2,a_00,sVar3);
  wwShLo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_18 = wwWordSize(in_R9,in_RDX);
  wwShLo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_28 = (word *)wwWordSize(b_00,in_R8);
  do {
    a_01 = in_R9;
    sVar3 = local_18;
    wwLoZeroBits(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
    wwShLo(in_stack_ffffffffffffff90,sVar3,(size_t)a_01);
    local_18 = wwWordSize(in_R9,local_18);
    in_stack_ffffffffffffff90 = b_00;
    in_stack_ffffffffffffff98 = local_28;
    wwLoZeroBits(local_28,(size_t)b_00);
    wwShLo(in_stack_ffffffffffffff90,sVar3,(size_t)a_01);
    local_28 = (word *)wwWordSize(b_00,(size_t)local_28);
    iVar1 = wwCmp2(a_00,(size_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,sVar3);
    if (iVar1 < 0) {
      wwXor2(b_00,in_R9,local_18);
    }
    else {
      wwXor2(in_R9,b_00,(size_t)local_28);
    }
    bVar2 = wwIsZero(in_R9,local_18);
  } while (bVar2 == 0);
  wwCopy(in_RDI,b_00,(size_t)local_28);
  wwBitSize(a_01,(size_t)in_RDI);
  wwShHi(in_stack_ffffffffffffff90,sVar3,(size_t)a_01);
  return;
}

Assistant:

void ppGCD(word d[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register size_t s;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	stack = v + m;
	// pre
	ASSERT(wwIsDisjoint2(a, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(b, m, d, MIN2(n, m)));
	ASSERT(!wwIsZero(a, n) && !wwIsZero(b, m));
	// d <- 0
	wwSetZero(d, MIN2(n, m));
	// u <- a, v <- b
	wwCopy(u, a, n);
	wwCopy(v, b, m);
	// найти максимальное s т.ч. x^s | u и x^s | v
	s = utilMin(2, wwLoZeroBits(u, n), wwLoZeroBits(v, m));
	// u <- u / x^s, v <- v / x^s
	wwShLo(u, n, s);
	n = wwWordSize(u, n);
	wwShLo(v, m, s);
	m = wwWordSize(v, m);
	// итерации
	do
	{
		wwShLo(u, n, wwLoZeroBits(u, n));
		n = wwWordSize(u, n);
		wwShLo(v, m, wwLoZeroBits(v, m));
		m = wwWordSize(v, m);
		// u >= v?
		if (wwCmp2(u, n, v, m) >= 0)
			// u <- u + v
			wwXor2(u, v, m);
		else
			// v <- v + u
			wwXor2(v, u, n);
	}
	while (!wwIsZero(u, n));
	// d <- v
	wwCopy(d, v, m);
	// d <- d * x^s
	wwShHi(d, W_OF_B(wwBitSize(d, m) + s), s);
	// очистка
	s = 0;
}